

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O0

int wally_witness_multisig_from_bytes
              (uchar *script,size_t script_len,uchar *bytes,size_t bytes_len,uint32_t *sighash,
              size_t sighash_len,uint32_t flags,wally_tx_witness_stack **witness)

{
  _Bool _Var1;
  uchar *size;
  size_t buf_len;
  size_t n_sigs;
  size_t scriptsig_len;
  uchar *puStack_50;
  int ret;
  uchar *scriptsig;
  size_t sighash_len_local;
  uint32_t *sighash_local;
  size_t bytes_len_local;
  uchar *bytes_local;
  size_t script_len_local;
  uchar *script_local;
  
  puStack_50 = (uchar *)0x0;
  scriptsig_len._4_4_ = 0;
  if (((((script != (uchar *)0x0) && (script_len != 0)) && (bytes != (uchar *)0x0)) &&
      ((bytes_len != 0 && (sighash != (uint32_t *)0x0)))) &&
     ((sighash_len != 0 &&
      ((witness != (wally_tx_witness_stack **)0x0 &&
       (scriptsig = (uchar *)sighash_len, sighash_len_local = (size_t)sighash,
       sighash_local = (uint32_t *)bytes_len, bytes_len_local = (size_t)bytes,
       bytes_local = (uchar *)script_len, script_len_local = (size_t)script,
       _Var1 = script_is_op_n(*script,false,&buf_len), _Var1)))))) {
    size = bytes_local + buf_len * 0x4a;
    puStack_50 = (uchar *)wally_malloc((size_t)size);
    if (puStack_50 == (uchar *)0x0) {
      return -3;
    }
    scriptsig_len._4_4_ =
         wally_scriptsig_multisig_from_bytes
                   ((uchar *)script_len_local,(size_t)bytes_local,(uchar *)bytes_len_local,
                    (size_t)sighash_local,(uint32_t *)sighash_len_local,(size_t)scriptsig,flags,
                    puStack_50,(size_t)size,&n_sigs);
    if (scriptsig_len._4_4_ == 0) {
      scriptsig_len._4_4_ = scriptsig_to_witness(puStack_50,n_sigs,witness);
    }
    clear_and_free(puStack_50,n_sigs);
    return scriptsig_len._4_4_;
  }
  return -2;
}

Assistant:

int wally_witness_multisig_from_bytes(
    const unsigned char *script,
    size_t script_len,
    const unsigned char *bytes,
    size_t bytes_len,
    const uint32_t *sighash,
    size_t sighash_len,
    uint32_t flags,
    struct wally_tx_witness_stack **witness)
{
    unsigned char *scriptsig = NULL;
    int ret = WALLY_OK;
    size_t scriptsig_len, n_sigs, buf_len;

    if (!script || !script_len || !bytes || !bytes_len || !sighash || !sighash_len ||
        !witness || !script_is_op_n(script[0], false, &n_sigs))
        return WALLY_EINVAL;

    buf_len = n_sigs * (EC_SIGNATURE_DER_MAX_LEN + 2) + script_len;
    if (!(scriptsig = wally_malloc(buf_len)))
        return WALLY_ENOMEM;

    ret = wally_scriptsig_multisig_from_bytes(script, script_len,
                                              bytes, bytes_len,
                                              sighash, sighash_len, flags,
                                              scriptsig, buf_len, &scriptsig_len);
    if (ret == WALLY_OK)
        ret = scriptsig_to_witness(scriptsig, scriptsig_len, witness);

    clear_and_free(scriptsig, scriptsig_len);
    return ret;
}